

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall Assimp::OpenGEX::OpenGEXImporter::OpenGEXImporter(OpenGEXImporter *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_007ddf60;
  p_Var1 = &(this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header;
  this->m_root = (ChildInfo *)0x0;
  *(undefined8 *)&(this->m_nodeChildMap)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_meshCache).
  super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->m_mesh2refMap)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->m_material2refMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_material2refMap)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_ctx = (Context *)0x0;
  lVar2 = 0;
  do {
    *(char **)((long)&this->m_metrics[0].m_stringValue._M_dataplus._M_p + lVar2) =
         this->m_metrics[0].m_stringValue.field_2._M_local_buf + lVar2;
    *(undefined8 *)((long)&this->m_metrics[0].m_stringValue._M_string_length + lVar2) = 0;
    this->m_metrics[0].m_stringValue.field_2._M_local_buf[lVar2] = '\0';
    *(undefined8 *)((long)&this->m_metrics[0].m_floatValue + lVar2) = 0xffffffff00000000;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0xa0);
  memset(&this->m_currentNode,0,0xe8);
  this->m_tokenType = -1;
  (this->m_materialCache).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_materialCache).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_materialCache).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cameraCache).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_unresolvedRefStack).
  super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unresolvedRefStack).
  super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unresolvedRefStack).
  super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

OpenGEXImporter::OpenGEXImporter()
: m_root( nullptr )
, m_nodeChildMap()
, m_meshCache()
, m_mesh2refMap()
, m_material2refMap()
, m_ctx( nullptr )
, m_metrics()
, m_currentNode( nullptr )
, m_currentVertices()
, m_currentMesh( nullptr )
, m_currentMaterial( nullptr )
, m_currentLight( nullptr )
, m_currentCamera( nullptr )
, m_tokenType( Grammar::NoneType )
, m_materialCache()
, m_cameraCache()
, m_lightCache()
, m_nodeStack()
, m_unresolvedRefStack() {
    // empty
}